

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewFunctionProcessingVisitor.cpp
# Opt level: O0

void __thiscall
NewFunctionProcessingVisitor::Visit
          (NewFunctionProcessingVisitor *this,AssignmentStatement *statement)

{
  VariableValue *this_00;
  int iVar1;
  Value *pVVar2;
  ArrayValue *local_178;
  string local_148;
  Symbol local_128;
  int local_104;
  undefined1 local_100 [4];
  int index_2;
  Symbol local_e0;
  string local_c0;
  Symbol local_a0;
  int local_7c;
  int local_78;
  int index_1;
  int array_index;
  string local_68;
  Symbol local_48;
  int local_24;
  Value *pVStack_20;
  int index;
  Value *value;
  AssignmentStatement *statement_local;
  NewFunctionProcessingVisitor *this_local;
  
  value = (Value *)statement;
  statement_local = (AssignmentStatement *)this;
  pVStack_20 = TemplateVisitor<Value_*>::Accept
                         (&this->super_TemplateVisitor<Value_*>,&statement->expression_->super_Node)
  ;
  if (*(int *)(value[1]._vptr_Value + 7) == 1) {
    std::__cxx11::string::string((string *)&local_68,(string *)(value[1]._vptr_Value[5] + 8));
    Symbol::Symbol(&local_48,&local_68);
    iVar1 = FunctionTable::Get(&this->table_,&local_48);
    Symbol::~Symbol(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    local_24 = iVar1;
    pVVar2 = TemplateVisitor<Value_*>::Accept
                       (&this->super_TemplateVisitor<Value_*>,
                        *(Node **)(value[1]._vptr_Value[5] + 0x28));
    local_78 = (*pVVar2->_vptr_Value[2])();
    pVVar2 = FrameEmulator::Get(&this->frame_,local_24);
    if (pVVar2 == (Value *)0x0) {
      local_178 = (ArrayValue *)0x0;
    }
    else {
      local_178 = (ArrayValue *)__dynamic_cast(pVVar2,&Value::typeinfo,&ArrayValue::typeinfo,0);
    }
    ArrayValue::SetAtIndex(local_178,pVStack_20,(long)local_78);
  }
  else if (*(int *)(value[1]._vptr_Value + 7) == 2) {
    std::__cxx11::string::string((string *)&local_c0,(string *)(value[1]._vptr_Value[6] + 8));
    Symbol::Symbol(&local_a0,&local_c0);
    iVar1 = FunctionTable::Get(&this->table_,&local_a0);
    Symbol::~Symbol(&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    this_00 = this->this_;
    local_7c = iVar1;
    std::__cxx11::string::string((string *)local_100,(string *)(value[1]._vptr_Value[6] + 8));
    Symbol::Symbol(&local_e0,(string *)local_100);
    VariableValue::SetField(this_00,&local_e0,pVStack_20);
    Symbol::~Symbol(&local_e0);
    std::__cxx11::string::~string((string *)local_100);
    FrameEmulator::Set(&this->frame_,local_7c,pVStack_20);
  }
  else {
    std::__cxx11::string::string((string *)&local_148,(string *)(value[1]._vptr_Value + 1));
    Symbol::Symbol(&local_128,&local_148);
    iVar1 = FunctionTable::Get(&this->table_,&local_128);
    Symbol::~Symbol(&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    local_104 = iVar1;
    FrameEmulator::Set(&this->frame_,iVar1,pVStack_20);
  }
  return;
}

Assistant:

void NewFunctionProcessingVisitor::Visit(AssignmentStatement* statement) {
  auto value = Accept(statement->expression_);
  if (statement->lvalue_->code_ == Lvalue::CODE::ARR) {
    int index = table_.Get(
        Symbol(statement->lvalue_->array_access_expression_->array_indent_));
    int array_index =
        Accept(statement->lvalue_->array_access_expression_->index_expression_)
            ->GetValue();

    dynamic_cast<ArrayValue*>(frame_.Get(index))
        ->SetAtIndex(value, array_index);
  } else if (statement->lvalue_->code_ == Lvalue::CODE::FIELD) {
    int index =
        table_.Get(Symbol(statement->lvalue_->field_access_->field_name_));

    this_->SetField(Symbol(statement->lvalue_->field_access_->field_name_),
                    value);

    frame_.Set(index, value);
  } else {
    int index = table_.Get(Symbol(statement->lvalue_->variable_name_));

    frame_.Set(index, value);
  }
}